

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O2

vector<DukValue,_std::allocator<DukValue>_> * __thiscall
dukglue::types::DukType<std::vector<DukValue,std::allocator<DukValue>>>::
read<std::vector<DukValue,std::allocator<DukValue>>>
          (vector<DukValue,_std::allocator<DukValue>_> *__return_storage_ptr__,
          DukType<std::vector<DukValue,std::allocator<DukValue>>> *this,duk_context *ctx,
          duk_idx_t arg_idx)

{
  duk_bool_t dVar1;
  duk_idx_t arg_idx_00;
  uint uVar2;
  duk_size_t __n;
  char *pcVar3;
  duk_idx_t idx;
  duk_size_t dVar4;
  DukValue local_78;
  
  idx = (duk_idx_t)ctx;
  dVar1 = duk_is_array((duk_context *)this,idx);
  if (dVar1 != 0) {
    __n = duk_get_length((duk_context *)this,idx);
    arg_idx_00 = duk_get_top((duk_context *)this);
    (__return_storage_ptr__->super__Vector_base<DukValue,_std::allocator<DukValue>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<DukValue,_std::allocator<DukValue>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<DukValue,_std::allocator<DukValue>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<DukValue,_std::allocator<DukValue>_>::reserve(__return_storage_ptr__,__n);
    for (dVar4 = 0; __n != dVar4; dVar4 = dVar4 + 1) {
      duk_get_prop_index((duk_context *)this,idx,(duk_uarridx_t)dVar4);
      DukType<DukValue>::read<DukValue>(&local_78,(duk_context *)this,arg_idx_00);
      std::vector<DukValue,_std::allocator<DukValue>_>::emplace_back<DukValue>
                (__return_storage_ptr__,&local_78);
      DukValue::~DukValue(&local_78);
      duk_pop((duk_context *)this);
    }
    return __return_storage_ptr__;
  }
  uVar2 = duk_get_type((duk_context *)this,idx);
  if (uVar2 < 10) {
    pcVar3 = *(char **)(detail::get_type_name(int)::names + (ulong)uVar2 * 8);
  }
  else {
    pcVar3 = "unknown";
  }
  duk_error_raw((duk_context *)this,6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                ,0x93,"Argument %d: expected array, got %s",(ulong)ctx & 0xffffffff,pcVar3);
}

Assistant:

static std::vector<T> read(duk_context* ctx, duk_idx_t arg_idx) {
				if (!duk_is_array(ctx, arg_idx)) {
					duk_int_t type_idx = duk_get_type(ctx, arg_idx);
					duk_error(ctx, DUK_ERR_TYPE_ERROR, "Argument %d: expected array, got %s", arg_idx, detail::get_type_name(type_idx));
				}

				duk_size_t len = duk_get_length(ctx, arg_idx);
				const duk_idx_t elem_idx = duk_get_top(ctx);

				std::vector<T> vec;
				vec.reserve(len);
				for (duk_size_t i = 0; i < len; i++) {
					duk_get_prop_index(ctx, arg_idx, i);
					vec.push_back(DukType< typename Bare<T>::type >::template read<T>(ctx, elem_idx));
					duk_pop(ctx);
				}
				return vec;
			}